

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

int __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::copy
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  uninitialized_copy_result<const_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
  uVar1;
  __uninitialized_copy_fn *unaff_retaddr;
  pointer dest;
  undefined1 in_stack_ffffffffffffffc8 [16];
  BumpAllocator *in_stack_ffffffffffffffd8;
  SmallVectorBase<(anonymous_namespace)::Constructable> *__ofirst;
  int iVar2;
  Constructable *in_stack_fffffffffffffff0;
  Constructable *in_stack_fffffffffffffff8;
  
  if (this->len == 0) {
    std::span<(anonymous_namespace)::Constructable,_18446744073709551615UL>::span
              ((span<(anonymous_namespace)::Constructable,_18446744073709551615UL> *)0x926949);
    iVar2 = (int)in_stack_fffffffffffffff0;
  }
  else {
    __ofirst = this;
    BumpAllocator::allocate
              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffc8._8_8_,
               in_stack_ffffffffffffffc8._0_8_);
    begin(this);
    end(this);
    uVar1 = std::ranges::__uninitialized_copy_fn::
            operator()<const_(anonymous_namespace)::Constructable_*,_const_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
                      (unaff_retaddr,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                       (Constructable *)__ofirst,(Constructable *)dst);
    iVar2 = (int)in_stack_fffffffffffffff0;
    std::span<(anonymous_namespace)::Constructable,_18446744073709551615UL>::
    span<(anonymous_namespace)::Constructable_*>
              ((span<(anonymous_namespace)::Constructable,_18446744073709551615UL> *)uVar1.out,
               uVar1.in,(size_type)this);
  }
  return iVar2;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }